

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O1

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::construct_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pvVar4;
  uint *puVar5;
  bool bVar6;
  ulong uVar7;
  uint *nxt;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(dist->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    puVar2[uVar10] = '\0';
    uVar10 = this->back_;
    this->back_ = uVar10 + 1;
    puVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(this->queue_->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2)) {
      puVar3[uVar10] = s;
      while( true ) {
        do {
          uVar10 = this->front_;
          if (this->back_ == uVar10) {
            return;
          }
          this->front_ = uVar10 + 1;
          puVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->queue_->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar10)
          goto LAB_0010a0a8;
          uVar11 = (ulong)puVar3[uVar10];
          puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar10 = uVar11;
          if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= uVar11)
          goto LAB_0010a0a8;
        } while (this->k_ <= puVar2[uVar11]);
        pvVar4 = (graph->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(graph->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                -0x5555555555555555;
        if (uVar7 < uVar11 || uVar7 - uVar11 == 0) break;
        puVar5 = *(pointer *)
                  ((long)&pvVar4[uVar11].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (puVar8 = pvVar4[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar5;
            puVar8 = puVar8 + 1) {
          uVar9 = (ulong)*puVar8;
          puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar7 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
          uVar10 = uVar9;
          if (uVar7 <= uVar9) goto LAB_0010a0a8;
          if (puVar2[uVar9] == '?') {
            uVar10 = uVar11;
            if (uVar7 <= uVar11) goto LAB_0010a0a8;
            puVar2[uVar9] = puVar2[uVar11] + '\x01';
            if ((this->isD2_ != true) || (bVar6 = indexed(&this->parent_->D1_,*puVar8), !bVar6)) {
              uVar1 = *puVar8;
              uVar10 = this->back_;
              this->back_ = uVar10 + 1;
              puVar3 = (this->queue_->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->queue_->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
                  uVar10) goto LAB_0010a0a8;
              puVar3[uVar10] = uVar1;
            }
          }
        }
      }
    }
  }
LAB_0010a0a8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::construct_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                          std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    dist.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}